

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetime.cpp
# Opt level: O2

weak_ordering compareThreeWay(QDateTime *lhs,QDateTime *rhs)

{
  QDateTimePrivate *pQVar1;
  QDateTimePrivate *pQVar2;
  bool bVar3;
  byte bVar4;
  ulong uVar5;
  qint64 qVar6;
  qint64 qVar7;
  ulong uVar8;
  Int IVar9;
  uint uVar10;
  
  pQVar1 = (lhs->d).d;
  if (((ulong)pQVar1 & 1) == 0) {
    uVar10 = (pQVar1->m_status).super_QFlagsStorageHelper<QDateTimePrivate::StatusFlag,_4>.
             super_QFlagsStorage<QDateTimePrivate::StatusFlag>.i;
  }
  else {
    uVar10 = (uint)pQVar1;
  }
  pQVar2 = (rhs->d).d;
  IVar9 = (Int)pQVar2;
  if ((uVar10 & 8) == 0) {
    if (((ulong)pQVar2 & 1) == 0) {
      IVar9 = (pQVar2->m_status).super_QFlagsStorageHelper<QDateTimePrivate::StatusFlag,_4>.
              super_QFlagsStorage<QDateTimePrivate::StatusFlag>.i;
    }
    bVar4 = (byte)((int)(IVar9 << 0x1c) >> 0x1f);
  }
  else {
    if (((ulong)pQVar2 & 1) == 0) {
      uVar5 = (ulong)(pQVar2->m_status).super_QFlagsStorageHelper<QDateTimePrivate::StatusFlag,_4>.
                     super_QFlagsStorage<QDateTimePrivate::StatusFlag>.i;
    }
    else {
      uVar5 = (ulong)pQVar2 & 0xffffffff;
    }
    bVar4 = 1;
    if ((uVar5 & 8) != 0) {
      if (((ulong)pQVar1 & 1) == 0) {
        qVar6 = pQVar1->m_msecs;
      }
      else {
        qVar6 = (long)pQVar1 >> 8;
      }
      if (((ulong)pQVar2 & 1) == 0) {
        qVar7 = pQVar2->m_msecs;
      }
      else {
        qVar7 = (long)pQVar2 >> 8;
      }
      bVar3 = usesSameOffset(&lhs->d,&rhs->d);
      if (!bVar3) {
        uVar8 = qVar6 - qVar7;
        uVar5 = -uVar8;
        if (0 < (long)uVar8) {
          uVar5 = uVar8;
        }
        if ((!SBORROW8(qVar6,qVar7)) && (uVar5 < 0x6ddd001)) {
          qVar6 = QDateTime::toMSecsSinceEpoch(lhs);
          qVar7 = QDateTime::toMSecsSinceEpoch(rhs);
          if (qVar6 != qVar7) {
            return (weak_ordering)(-(qVar6 < qVar7) | 1);
          }
          return (weak_ordering)'\0';
        }
      }
      bVar4 = -(qVar6 < qVar7) | 1;
      if (qVar6 == qVar7) {
        bVar4 = 0;
      }
    }
  }
  return (weak_ordering)bVar4;
}

Assistant:

Qt::weak_ordering compareThreeWay(const QDateTime &lhs, const QDateTime &rhs)
{
    if (!lhs.isValid())
        return rhs.isValid() ? Qt::weak_ordering::less : Qt::weak_ordering::equivalent;

    if (!rhs.isValid())
        return Qt::weak_ordering::greater; // we know that lhs is valid here

    const qint64 lhms = getMSecs(lhs.d), rhms = getMSecs(rhs.d);
    if (usesSameOffset(lhs.d, rhs.d) || areFarEnoughApart(lhms, rhms))
        return Qt::compareThreeWay(lhms, rhms);

    // Convert to UTC and compare
    return Qt::compareThreeWay(lhs.toMSecsSinceEpoch(), rhs.toMSecsSinceEpoch());
}